

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analysis.cc
# Opt level: O1

bool kratos::check_stmt_condition
               (Stmt *stmt,function<bool_(kratos::Stmt_*)> *cond,bool check_unreachable,
               bool full_branch)

{
  long *plVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  uint uVar3;
  bool bVar4;
  bool bVar5;
  char cVar6;
  byte bVar7;
  _Base_ptr p_Var8;
  long lVar9;
  StmtException *this;
  undefined8 *puVar10;
  InternalException *pIVar11;
  undefined7 in_register_00000009;
  map<std::shared_ptr<kratos::Const>,_std::shared_ptr<kratos::ScopedStmtBlock>,_std::less<std::shared_ptr<kratos::Const>_>,_std::allocator<std::pair<const_std::shared_ptr<kratos::Const>,_std::shared_ptr<kratos::ScopedStmtBlock>_>_>_>
  *pmVar12;
  long lVar13;
  int iVar14;
  Stmt *pSVar15;
  long lVar16;
  ulong uVar17;
  int iVar18;
  long lVar19;
  const_iterator local_b8;
  const_iterator local_b0;
  undefined1 auStack_a8 [8];
  vector<kratos::Stmt_*,_std::allocator<kratos::Stmt_*>_> stmts;
  undefined1 local_68 [8];
  map<std::shared_ptr<kratos::Const>,_std::shared_ptr<kratos::ScopedStmtBlock>,_std::less<std::shared_ptr<kratos::Const>_>,_std::allocator<std::pair<const_std::shared_ptr<kratos::Const>,_std::shared_ptr<kratos::ScopedStmtBlock>_>_>_>
  cases;
  
  local_68 = (undefined1  [8])stmt;
  if ((cond->super__Function_base)._M_manager == (_Manager_type)0x0) {
    std::__throw_bad_function_call();
  }
  bVar4 = (*cond->_M_invoker)((_Any_data *)cond,(Stmt **)local_68);
  bVar5 = true;
  if (!bVar4) {
    bVar5 = false;
    switch(stmt->type_) {
    case If:
      lVar9 = __dynamic_cast(stmt,&Stmt::typeinfo,&IfStmt::typeinfo);
      if (lVar9 == 0) {
        pIVar11 = (InternalException *)__cxa_allocate_exception(0x10);
        local_68 = (undefined1  [8])&cases._M_t._M_impl.super__Rb_tree_header;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_68,"Statement is not if but is marked as StatementType::If","");
        InternalException::InternalException(pIVar11,(string *)local_68);
        __cxa_throw(pIVar11,&InternalException::typeinfo,std::runtime_error::~runtime_error);
      }
      if (full_branch) {
        bVar4 = check_stmt_condition(*(Stmt **)(lVar9 + 0xe0),cond,check_unreachable,true);
        if (!bVar4) {
          return false;
        }
        pSVar15 = *(Stmt **)(lVar9 + 0xf0);
        bVar4 = true;
      }
      else {
        bVar4 = check_stmt_condition(*(Stmt **)(lVar9 + 0xe0),cond,check_unreachable,false);
        if (bVar4) {
          return true;
        }
        pSVar15 = *(Stmt **)(lVar9 + 0xf0);
        bVar4 = false;
      }
      bVar5 = check_stmt_condition(pSVar15,cond,check_unreachable,bVar4);
      break;
    case Switch:
      lVar9 = __dynamic_cast(stmt,&Stmt::typeinfo,&SwitchStmt::typeinfo,0);
      if (lVar9 == 0) {
        pIVar11 = (InternalException *)__cxa_allocate_exception(0x10);
        local_68 = (undefined1  [8])&cases._M_t._M_impl.super__Rb_tree_header;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_68,
                   "Statement is not switch but is marked as StatementType::Switch","");
        InternalException::InternalException(pIVar11,(string *)local_68);
        __cxa_throw(pIVar11,&InternalException::typeinfo,std::runtime_error::~runtime_error);
      }
      std::
      _Rb_tree<std::shared_ptr<kratos::Const>,_std::pair<const_std::shared_ptr<kratos::Const>,_std::shared_ptr<kratos::ScopedStmtBlock>_>,_std::_Select1st<std::pair<const_std::shared_ptr<kratos::Const>,_std::shared_ptr<kratos::ScopedStmtBlock>_>_>,_std::less<std::shared_ptr<kratos::Const>_>,_std::allocator<std::pair<const_std::shared_ptr<kratos::Const>,_std::shared_ptr<kratos::ScopedStmtBlock>_>_>_>
      ::_Rb_tree((_Rb_tree<std::shared_ptr<kratos::Const>,_std::pair<const_std::shared_ptr<kratos::Const>,_std::shared_ptr<kratos::ScopedStmtBlock>_>,_std::_Select1st<std::pair<const_std::shared_ptr<kratos::Const>,_std::shared_ptr<kratos::ScopedStmtBlock>_>_>,_std::less<std::shared_ptr<kratos::Const>_>,_std::allocator<std::pair<const_std::shared_ptr<kratos::Const>,_std::shared_ptr<kratos::ScopedStmtBlock>_>_>_>
                  *)local_68,
                 (_Rb_tree<std::shared_ptr<kratos::Const>,_std::pair<const_std::shared_ptr<kratos::Const>,_std::shared_ptr<kratos::ScopedStmtBlock>_>,_std::_Select1st<std::pair<const_std::shared_ptr<kratos::Const>,_std::shared_ptr<kratos::ScopedStmtBlock>_>_>,_std::less<std::shared_ptr<kratos::Const>_>,_std::allocator<std::pair<const_std::shared_ptr<kratos::Const>,_std::shared_ptr<kratos::ScopedStmtBlock>_>_>_>
                  *)(lVar9 + 0xe0));
      bVar5 = false;
      iVar14 = 0;
      if (cases._M_t._M_impl.super__Rb_tree_header._M_header._M_right != (_Base_ptr)0x0) {
        bVar4 = cases._M_t._M_impl.super__Rb_tree_header._M_header._M_parent == (_Base_ptr)&cases;
        cases._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ =
             (uint)CONCAT71(in_register_00000009,full_branch);
        if (!bVar4) {
          iVar14 = 0;
          p_Var8 = cases._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
          do {
            bVar5 = check_stmt_condition
                              ((Stmt *)p_Var8[1]._M_left,cond,check_unreachable,full_branch);
            iVar14 = iVar14 + (uint)bVar5;
            if (!bVar5 && full_branch) break;
            p_Var8 = (_Base_ptr)std::_Rb_tree_increment(p_Var8);
            bVar4 = p_Var8 == (_Rb_tree_node_base *)&cases;
          } while (!bVar4);
        }
        uVar3 = cases._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_;
        if (bVar4) {
          plVar1 = *(long **)(lVar9 + 0xc0);
          p_Var2 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(lVar9 + 200);
          if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
              UNLOCK();
            }
            else {
              p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
            }
          }
          cVar6 = (**(code **)(*plVar1 + 0xd0))();
          if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
          }
          plVar1 = *(long **)(lVar9 + 0xc0);
          p_Var2 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(lVar9 + 200);
          if (cVar6 == '\0') {
            if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
                UNLOCK();
              }
              else {
                p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
              }
            }
            bVar7 = (**(code **)(*plVar1 + 0x38))();
            iVar18 = 1 << (bVar7 & 0x1f);
            if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
            }
          }
          else {
            if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
                UNLOCK();
              }
              else {
                p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
              }
            }
            if (plVar1 == (long *)0x0) {
              puVar10 = (undefined8 *)0x0;
            }
            else {
              puVar10 = (undefined8 *)
                        __dynamic_cast(plVar1,&Var::typeinfo,&EnumType::typeinfo,0xfffffffffffffffe)
              ;
            }
            if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
            }
            if (puVar10 == (undefined8 *)0x0) {
              pIVar11 = (InternalException *)__cxa_allocate_exception(0x10);
              auStack_a8 = (undefined1  [8])
                           &stmts.
                            super__Vector_base<kratos::Stmt_*,_std::allocator<kratos::Stmt_*>_>.
                            _M_impl.super__Vector_impl_data._M_finish;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)auStack_a8,"Unable to resolve enum type","");
              InternalException::InternalException(pIVar11,(string *)auStack_a8);
              __cxa_throw(pIVar11,&InternalException::typeinfo,std::runtime_error::~runtime_error);
            }
            lVar9 = (**(code **)*puVar10)(puVar10);
            iVar18 = *(int *)(lVar9 + 0x38);
          }
          if ((char)uVar3 == '\0') {
            bVar5 = iVar14 != 0;
          }
          else {
            p_Var8 = (_Base_ptr)&cases;
            for (; (map<std::shared_ptr<kratos::Const>,_std::shared_ptr<kratos::ScopedStmtBlock>,_std::less<std::shared_ptr<kratos::Const>_>,_std::allocator<std::pair<const_std::shared_ptr<kratos::Const>,_std::shared_ptr<kratos::ScopedStmtBlock>_>_>_>
                    *)cases._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ !=
                   (map<std::shared_ptr<kratos::Const>,_std::shared_ptr<kratos::ScopedStmtBlock>,_std::less<std::shared_ptr<kratos::Const>_>,_std::allocator<std::pair<const_std::shared_ptr<kratos::Const>,_std::shared_ptr<kratos::ScopedStmtBlock>_>_>_>
                    *)0x0;
                cases._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
                     ((_Base_ptr)cases._M_t._M_impl.super__Rb_tree_header._M_header._0_8_)->_M_left)
            {
              p_Var8 = (_Base_ptr)cases._M_t._M_impl.super__Rb_tree_header._M_header._0_8_;
            }
            pmVar12 = &cases;
            if ((p_Var8 != (_Base_ptr)&cases) &&
               (pmVar12 = (map<std::shared_ptr<kratos::Const>,_std::shared_ptr<kratos::ScopedStmtBlock>,_std::less<std::shared_ptr<kratos::Const>_>,_std::allocator<std::pair<const_std::shared_ptr<kratos::Const>,_std::shared_ptr<kratos::ScopedStmtBlock>_>_>_>
                           *)p_Var8,
               (((map<std::shared_ptr<kratos::Const>,_std::shared_ptr<kratos::ScopedStmtBlock>,_std::less<std::shared_ptr<kratos::Const>_>,_std::allocator<std::pair<const_std::shared_ptr<kratos::Const>,_std::shared_ptr<kratos::ScopedStmtBlock>_>_>_>
                  *)p_Var8)->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right !=
               (_Base_ptr)0x0)) {
              pmVar12 = &cases;
            }
            bVar5 = iVar14 == iVar18 || pmVar12 != &cases;
          }
        }
        else {
          bVar5 = false;
        }
      }
      std::
      _Rb_tree<std::shared_ptr<kratos::Const>,_std::pair<const_std::shared_ptr<kratos::Const>,_std::shared_ptr<kratos::ScopedStmtBlock>_>,_std::_Select1st<std::pair<const_std::shared_ptr<kratos::Const>,_std::shared_ptr<kratos::ScopedStmtBlock>_>_>,_std::less<std::shared_ptr<kratos::Const>_>,_std::allocator<std::pair<const_std::shared_ptr<kratos::Const>,_std::shared_ptr<kratos::ScopedStmtBlock>_>_>_>
      ::~_Rb_tree((_Rb_tree<std::shared_ptr<kratos::Const>,_std::pair<const_std::shared_ptr<kratos::Const>,_std::shared_ptr<kratos::ScopedStmtBlock>_>,_std::_Select1st<std::pair<const_std::shared_ptr<kratos::Const>,_std::shared_ptr<kratos::ScopedStmtBlock>_>_>,_std::less<std::shared_ptr<kratos::Const>_>,_std::allocator<std::pair<const_std::shared_ptr<kratos::Const>,_std::shared_ptr<kratos::ScopedStmtBlock>_>_>_>
                   *)local_68);
      break;
    case For:
      lVar9 = __dynamic_cast(stmt,&Stmt::typeinfo,&ForStmt::typeinfo,0);
      if (lVar9 == 0) {
        pIVar11 = (InternalException *)__cxa_allocate_exception(0x10);
        local_68 = (undefined1  [8])&cases._M_t._M_impl.super__Rb_tree_header;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_68,"Statement is not if but is marked as StatementType::For","");
        InternalException::InternalException(pIVar11,(string *)local_68);
        __cxa_throw(pIVar11,&InternalException::typeinfo,std::runtime_error::~runtime_error);
      }
      pSVar15 = *(Stmt **)(lVar9 + 0xe8);
      p_Var2 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(lVar9 + 0xf0);
      if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
          UNLOCK();
        }
        else {
          p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
        }
      }
      bVar5 = check_stmt_condition(pSVar15,cond,check_unreachable,full_branch);
      if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
      }
      break;
    case Block:
      lVar9 = __dynamic_cast(stmt,&Stmt::typeinfo,&StmtBlock::typeinfo,0);
      if (lVar9 == 0) {
        pIVar11 = (InternalException *)__cxa_allocate_exception(0x10);
        local_68 = (undefined1  [8])&cases._M_t._M_impl.super__Rb_tree_header;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_68,"Statement is not block but is marked as StatementType::Block"
                   ,"");
        InternalException::InternalException(pIVar11,(string *)local_68);
        __cxa_throw(pIVar11,&InternalException::typeinfo,std::runtime_error::~runtime_error);
      }
      lVar13 = *(long *)(lVar9 + 200) - *(long *)(lVar9 + 0xc0);
      if (lVar13 == 0) {
        lVar19 = 0;
        bVar5 = false;
      }
      else {
        lVar13 = lVar13 >> 4;
        lVar16 = 8;
        lVar19 = 0;
        cases._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ = (uint)full_branch;
        do {
          pSVar15 = *(Stmt **)(*(long *)(lVar9 + 0xc0) + -8 + lVar16);
          p_Var2 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
                    (*(long *)(lVar9 + 0xc0) + lVar16);
          if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
              UNLOCK();
            }
            else {
              p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
            }
            if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
            }
          }
          bVar4 = check_stmt_condition
                            (pSVar15,cond,check_unreachable,
                             SUB41(cases._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_,0));
          bVar5 = false;
          if (bVar4) {
            bVar5 = true;
            break;
          }
          lVar19 = lVar19 + 1;
          lVar16 = lVar16 + 0x10;
        } while (lVar13 + (ulong)(lVar13 == 0) != lVar19);
      }
      if (((check_unreachable & bVar5) == 1) &&
         (lVar19 != (*(long *)(lVar9 + 200) - *(long *)(lVar9 + 0xc0) >> 4) + -1)) {
        auStack_a8 = (undefined1  [8])0x0;
        stmts.super__Vector_base<kratos::Stmt_*,_std::allocator<kratos::Stmt_*>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        stmts.super__Vector_base<kratos::Stmt_*,_std::allocator<kratos::Stmt_*>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        uVar17 = lVar19 + 1;
        lVar13 = *(long *)(lVar9 + 0xc0);
        if (uVar17 < (ulong)(*(long *)(lVar9 + 200) - lVar13 >> 4)) {
          lVar19 = lVar19 * 0x10 + 0x18;
          do {
            local_68 = *(undefined1 (*) [8])(lVar13 + -8 + lVar19);
            p_Var2 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(lVar13 + lVar19);
            if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
                UNLOCK();
              }
              else {
                p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
              }
            }
            std::vector<kratos::Stmt*,std::allocator<kratos::Stmt*>>::emplace_back<kratos::Stmt*>
                      ((vector<kratos::Stmt*,std::allocator<kratos::Stmt*>> *)auStack_a8,
                       (Stmt **)local_68);
            if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
            }
            uVar17 = uVar17 + 1;
            lVar13 = *(long *)(lVar9 + 0xc0);
            lVar19 = lVar19 + 0x10;
          } while (uVar17 < (ulong)(*(long *)(lVar9 + 200) - lVar13 >> 4));
        }
        this = (StmtException *)__cxa_allocate_exception(0x10);
        local_68 = (undefined1  [8])&cases._M_t._M_impl.super__Rb_tree_header;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_68,"Unreachable code block","");
        local_b8._M_current = (Stmt **)auStack_a8;
        local_b0._M_current =
             stmts.super__Vector_base<kratos::Stmt_*,_std::allocator<kratos::Stmt_*>_>._M_impl.
             super__Vector_impl_data._M_start;
        StmtException::StmtException(this,(string *)local_68,&local_b8,&local_b0);
        __cxa_throw(this,&StmtException::typeinfo,std::runtime_error::~runtime_error);
      }
    }
  }
  return bVar5;
}

Assistant:

bool check_stmt_condition(Stmt* stmt, const std::function<bool(Stmt*)>& cond,
                          bool check_unreachable = false, bool full_branch = true) {
    if (cond(stmt)) {
        return true;
    } else if (stmt->type() == StatementType::Block) {
        // it has to be the last block
        uint64_t index;
        bool found = false;
        auto* block = dynamic_cast<StmtBlock*>(stmt);
        if (!block)
            throw InternalException("Statement is not block but is marked as StatementType::Block");
        auto stmt_count = block->size();
        for (index = 0; index < stmt_count; index++) {
            auto* s = block->get_stmt(index).get();
            if (check_stmt_condition(s, cond, check_unreachable, full_branch)) {
                found = true;
                break;
            }
        }
        if (found && check_unreachable) {
            if (index != block->size() - 1) {
                // we have unreachable state
                std::vector<Stmt*> stmts;
                for (uint64_t i = index + 1; i < block->size(); i++)
                    stmts.emplace_back(block->get_stmt(i).get());
                throw StmtException("Unreachable code block", stmts.begin(), stmts.end());
            }
        }
        return found;
    } else if (stmt->type() == StatementType::Switch) {
        auto* stmt_ = dynamic_cast<SwitchStmt*>(stmt);
        if (!stmt_)
            throw InternalException(
                "Statement is not switch but is marked as StatementType::Switch");
        auto cases = stmt_->body();
        if (cases.empty()) return false;
        uint32_t found_case = 0;
        for (auto const& iter : cases) {
            auto* scope_stmt = iter.second.get();
            if (check_stmt_condition(scope_stmt, cond, check_unreachable, full_branch))
                found_case++;
            else if (full_branch)
                return false;
        }
        // make sure default case is covered
        // if there is no default case, all the cases have to be covered
        // the only exception is that if the target is an enum and we've covered all it's enum case
        uint32_t targeted_cases;
        if (stmt_->target()->is_enum()) {
            auto* enum_var = dynamic_cast<EnumType*>(stmt_->target().get());
            if (!enum_var) throw InternalException("Unable to resolve enum type");
            auto const* enum_def = enum_var->enum_type();
            targeted_cases = enum_def->values.size();
        } else {
            targeted_cases = 1u << stmt_->target()->width();
        }
        if (full_branch) {
            return cases.find(nullptr) != cases.end() || found_case == targeted_cases;
        } else {
            return found_case > 0;
        }
    } else if (stmt->type() == StatementType::If) {
        auto* stmt_ = dynamic_cast<IfStmt*>(stmt);
        if (!stmt_)
            throw InternalException("Statement is not if but is marked as StatementType::If");
        auto const& then = stmt_->then_body();
        auto const& else_ = stmt_->else_body();
        if (full_branch) {
            return check_stmt_condition(then.get(), cond, check_unreachable, full_branch) &&
                   check_stmt_condition(else_.get(), cond, check_unreachable, full_branch);
        } else {
            return check_stmt_condition(then.get(), cond, check_unreachable, full_branch) ||
                   check_stmt_condition(else_.get(), cond, check_unreachable, full_branch);
        }
    } else if (stmt->type() == StatementType::For) {
        auto* stmt_ = dynamic_cast<ForStmt*>(stmt);
        if (!stmt_)
            throw InternalException("Statement is not if but is marked as StatementType::For");
        auto body = stmt_->get_loop_body();
        return check_stmt_condition(body.get(), cond, check_unreachable, full_branch);
    }
    return false;
}